

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armci.c
# Opt level: O1

int PARMCI_GetV(armci_giov_t *darr,int len,int proc)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  int iVar4;
  comex_giov_t *iov;
  long lVar5;
  
  iov = (comex_giov_t *)malloc((long)len * 0x18);
  if (0 < len) {
    lVar5 = 0;
    do {
      puVar1 = (undefined8 *)((long)&darr->src_ptr_array + lVar5);
      uVar3 = puVar1[1];
      puVar2 = (undefined8 *)((long)&iov->src + lVar5);
      *puVar2 = *puVar1;
      puVar2[1] = uVar3;
      *(undefined8 *)((long)&iov->count + lVar5) =
           *(undefined8 *)((long)&darr->ptr_array_len + lVar5);
      lVar5 = lVar5 + 0x18;
    } while ((ulong)(uint)len * 0x18 != lVar5);
  }
  iVar4 = comex_getv(iov,len,proc,0);
  free(iov);
  return iVar4;
}

Assistant:

int PARMCI_GetV(armci_giov_t *darr, int len, int proc)
{
    int rc;
    comex_giov_t *adarr = malloc(sizeof(comex_giov_t) * len);
    convert_giov(darr, adarr, len);
    rc = comex_getv(adarr, len, proc, COMEX_GROUP_WORLD);
    free(adarr);
    return rc;
}